

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void mtrap_display(menu *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  char *buf;
  uint8_t attr_00;
  void *pvVar1;
  char *desc;
  uint8_t attr;
  trap_kind_conflict *choice;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu *menu_local;
  
  pvVar1 = menu_priv((menu_conflict *)menu);
  attr_00 = '\x01';
  if (cursor) {
    attr_00 = '\x0e';
  }
  buf = *(char **)((long)pvVar1 + (long)oid * 0x88 + 0x10);
  my_strcap(buf);
  c_put_str(attr_00,buf,row,col);
  return;
}

Assistant:

static void mtrap_display(struct menu *menu, int oid, bool cursor, int row,
				   int col, int width)
{
	const struct trap_kind *choice = menu_priv(menu);
	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
	char *desc = choice[oid].desc;
	my_strcap(desc);

	/* Print it */
	c_put_str(attr, desc, row, col);
}